

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcAnalyzer::HdlcBytesToVectorBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *asyncBytes)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  U8 local_29;
  uint local_28;
  undefined1 local_21;
  U32 i;
  vector<HdlcByte,_std::allocator<HdlcByte>_> *asyncBytes_local;
  HdlcAnalyzer *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  local_21 = 0;
  _i = asyncBytes;
  asyncBytes_local = (vector<HdlcByte,_std::allocator<HdlcByte>_> *)this;
  this_local = (HdlcAnalyzer *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  for (local_28 = 0; uVar1 = (ulong)local_28,
      sVar2 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::size(_i), uVar1 < sVar2;
      local_28 = local_28 + 1) {
    pvVar3 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::operator[](_i,(ulong)local_28);
    if ((pvVar3->escaped & 1U) == 0) {
      pvVar3 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::operator[](_i,(ulong)local_28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&pvVar3->value);
    }
    else {
      pvVar3 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::operator[](_i,(ulong)local_28);
      local_29 = HdlcAnalyzerSettings::Bit5Inv(pvVar3->value);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_29);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcAnalyzer::HdlcBytesToVectorBytes( const vector<HdlcByte>& asyncBytes ) const
{
    vector<U8> ret;
    for( U32 i = 0; i < asyncBytes.size(); ++i )
    {
        if( asyncBytes[ i ].escaped )
            ret.push_back( HdlcAnalyzerSettings::Bit5Inv( asyncBytes[ i ].value ) );
        else
            ret.push_back( asyncBytes[ i ].value );
    }
    return ret;
}